

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_unknown_test.cc
# Opt level: O1

upb_UnknownCompareResult CompareUnknown(UnknownFields *uf1,UnknownFields *uf2)

{
  upb_UnknownCompareResult uVar1;
  vector<UnknownField,_std::allocator<UnknownField>_> vStack_38;
  vector<UnknownField,_std::allocator<UnknownField>_> local_20;
  
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector(&local_20,uf1);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector(&vStack_38,uf2);
  uVar1 = CompareUnknownWithMaxDepth(&local_20,&vStack_38,0x40);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector(&vStack_38);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector(&local_20);
  return uVar1;
}

Assistant:

upb_UnknownCompareResult CompareUnknown(UnknownFields uf1, UnknownFields uf2) {
  return CompareUnknownWithMaxDepth(uf1, uf2, 64);
}